

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

void readDeepScanLine(DeepScanLineInputPart *in,DeepFrameBuffer *buf,
                     vector<double,_std::allocator<double>_> *samplePerf,
                     vector<double,_std::allocator<double>_> *countPerf)

{
  int iVar1;
  iterator iVar2;
  long lVar3;
  long lVar4;
  double local_38;
  
  Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)in);
  Imf_3_4::DeepScanLineInputPart::header();
  lVar3 = Imf_3_4::Header::dataWindow();
  iVar1 = *(int *)(lVar3 + 4);
  lVar3 = std::chrono::_V2::steady_clock::now();
  Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)in,iVar1);
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_38 = (double)(lVar4 - lVar3) / 1000000000.0;
  iVar2._M_current =
       (countPerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (countPerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (countPerf,iVar2,&local_38);
  }
  else {
    *iVar2._M_current = local_38;
    (countPerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
    ._M_finish = iVar2._M_current + 1;
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  Imf_3_4::DeepScanLineInputPart::readPixels((int)in,iVar1);
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_38 = (double)(lVar4 - lVar3) / 1000000000.0;
  iVar2._M_current =
       (samplePerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (samplePerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (samplePerf,iVar2,&local_38);
  }
  else {
    *iVar2._M_current = local_38;
    (samplePerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void
readDeepScanLine (
    DeepScanLineInputPart& in,
    DeepFrameBuffer&       buf,
    vector<double>&        samplePerf,
    vector<double>&        countPerf)
{

    in.setFrameBuffer (buf);
    Box2i dw = in.header ().dataWindow ();

    steady_clock::time_point startCountRead = steady_clock::now ();
    in.readPixelSampleCounts (dw.min.y, dw.max.y);
    steady_clock::time_point endCountRead = steady_clock::now ();
    countPerf.push_back (timing (startCountRead, endCountRead));

    steady_clock::time_point startSampleRead = steady_clock::now ();
    in.readPixels (dw.min.y, dw.max.y);
    steady_clock::time_point endSampleRead = steady_clock::now ();
    samplePerf.push_back (timing (startSampleRead, endSampleRead));
}